

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

Symbol * __thiscall slang::ast::ASTContext::getContainingSymbol(ASTContext *this)

{
  Scope *this_00;
  ASTContext *in_RDI;
  Symbol *containingSym;
  undefined8 local_10;
  
  local_10 = (SubroutineSymbol *)getProceduralBlock(in_RDI);
  if (local_10 == (SubroutineSymbol *)0x0) {
    local_10 = getContainingSubroutine(in_RDI);
  }
  if (local_10 == (SubroutineSymbol *)0x0) {
    this_00 = not_null<const_slang::ast::Scope_*>::operator->
                        ((not_null<const_slang::ast::Scope_*> *)0x4a7463);
    local_10 = (SubroutineSymbol *)Scope::asSymbol(this_00);
  }
  return &local_10->super_Symbol;
}

Assistant:

const Symbol& ASTContext::getContainingSymbol() const {
    const Symbol* containingSym = getProceduralBlock();
    if (!containingSym)
        containingSym = getContainingSubroutine();

    if (!containingSym)
        containingSym = &scope->asSymbol();

    return *containingSym;
}